

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * google::protobuf::compiler::php::LegacyGeneratedClassFileName<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *desc,bool is_descriptor)

{
  int i;
  ulong uVar1;
  string result;
  string local_28;
  
  LegacyFullClassName<google::protobuf::Descriptor>(&local_28,desc,is_descriptor);
  for (uVar1 = 0; uVar1 < local_28._M_string_length; uVar1 = uVar1 + 1) {
    if (local_28._M_dataplus._M_p[uVar1] == '\\') {
      local_28._M_dataplus._M_p[uVar1] = '/';
    }
  }
  std::operator+(__return_storage_ptr__,&local_28,".php");
  std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string LegacyGeneratedClassFileName(const DescriptorType* desc,
                                     bool is_descriptor) {
  std::string result = LegacyFullClassName(desc, is_descriptor);

  for (int i = 0; i < result.size(); i++) {
    if (result[i] == '\\') {
      result[i] = '/';
    }
  }
  return result + ".php";
}